

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

int ncnn::from_rgba(uchar *rgba,int w,int h,int stride,Mat *m,Allocator *allocator)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  long *in_R8;
  bool bVar2;
  int remain;
  int y;
  float *ptr3;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int wgap;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Allocator *in_stack_fffffffffffffb30;
  size_t in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  Mat *in_stack_fffffffffffffb50;
  int local_430;
  int local_42c;
  float *local_3e0;
  float *local_390;
  float *local_340;
  float *local_2f0;
  int local_2c8;
  int local_2c4;
  byte *local_2c0;
  int local_2b4;
  
  Mat::create(in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
              (int)in_stack_fffffffffffffb48,(int)((ulong)in_stack_fffffffffffffb40 >> 0x20),
              in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  bVar2 = true;
  if (*in_R8 != 0) {
    bVar2 = in_R8[8] * (long)(int)in_R8[7] == 0;
  }
  if (bVar2) {
    local_2b4 = -100;
  }
  else {
    iVar1 = in_ECX + in_ESI * -4;
    local_2c8 = in_EDX;
    local_2c4 = in_ESI;
    if (iVar1 == 0) {
      local_2c4 = in_ESI * in_EDX;
      local_2c8 = 1;
    }
    local_2f0 = (float *)*in_R8;
    local_340 = (float *)(*in_R8 + in_R8[8] * in_R8[2]);
    local_390 = (float *)(*in_R8 + in_R8[8] * 2 * in_R8[2]);
    local_3e0 = (float *)(*in_R8 + in_R8[8] * 3 * in_R8[2]);
    local_2c0 = in_RDI;
    for (local_42c = 0; local_42c < local_2c8; local_42c = local_42c + 1) {
      for (local_430 = local_2c4; 0 < local_430; local_430 = local_430 + -1) {
        *local_2f0 = (float)*local_2c0;
        *local_340 = (float)local_2c0[1];
        *local_390 = (float)local_2c0[2];
        *local_3e0 = (float)local_2c0[3];
        local_2c0 = local_2c0 + 4;
        local_2f0 = local_2f0 + 1;
        local_340 = local_340 + 1;
        local_390 = local_390 + 1;
        local_3e0 = local_3e0 + 1;
      }
      local_2c0 = local_2c0 + iVar1;
    }
    local_2b4 = 0;
  }
  return local_2b4;
}

Assistant:

static int from_rgba(const unsigned char* rgba, int w, int h, int stride, Mat& m, Allocator* allocator)
{
    m.create(w, h, 4, 4u, allocator);
    if (m.empty())
        return -100;

    const int wgap = stride - w * 4;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    float* ptr0 = m.channel(0);
    float* ptr1 = m.channel(1);
    float* ptr2 = m.channel(2);
    float* ptr3 = m.channel(3);

    for (int y = 0; y < h; y++)
    {
#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
        for (; nn > 0; nn--)
        {
            uint8x8x4_t _rgba = vld4_u8(rgba);
            int16x8_t _r16 = vreinterpretq_s16_u16(vmovl_u8(_rgba.val[0]));
            int16x8_t _g16 = vreinterpretq_s16_u16(vmovl_u8(_rgba.val[1]));
            int16x8_t _b16 = vreinterpretq_s16_u16(vmovl_u8(_rgba.val[2]));
            int16x8_t _a16 = vreinterpretq_s16_u16(vmovl_u8(_rgba.val[3]));

            float32x4_t _rlow = vcvtq_f32_s32(vmovl_s16(vget_low_s16(_r16)));
            float32x4_t _rhigh = vcvtq_f32_s32(vmovl_s16(vget_high_s16(_r16)));
            float32x4_t _glow = vcvtq_f32_s32(vmovl_s16(vget_low_s16(_g16)));
            float32x4_t _ghigh = vcvtq_f32_s32(vmovl_s16(vget_high_s16(_g16)));
            float32x4_t _blow = vcvtq_f32_s32(vmovl_s16(vget_low_s16(_b16)));
            float32x4_t _bhigh = vcvtq_f32_s32(vmovl_s16(vget_high_s16(_b16)));
            float32x4_t _alow = vcvtq_f32_s32(vmovl_s16(vget_low_s16(_a16)));
            float32x4_t _ahigh = vcvtq_f32_s32(vmovl_s16(vget_high_s16(_a16)));

            vst1q_f32(ptr0, _rlow);
            vst1q_f32(ptr0 + 4, _rhigh);
            vst1q_f32(ptr1, _glow);
            vst1q_f32(ptr1 + 4, _ghigh);
            vst1q_f32(ptr2, _blow);
            vst1q_f32(ptr2 + 4, _bhigh);
            vst1q_f32(ptr3, _alow);
            vst1q_f32(ptr3 + 4, _ahigh);

            rgba += 4 * 8;
            ptr0 += 8;
            ptr1 += 8;
            ptr2 += 8;
            ptr3 += 8;
        }
#else
        if (nn > 0)
        {
            asm volatile(
                "0:                             \n"
                "pld        [%1, #256]          \n"
                "vld4.u8    {d0-d3}, [%1]!      \n"
                "vmovl.u8   q8, d0              \n"
                "vmovl.u8   q9, d1              \n"
                "vmovl.u8   q10, d2             \n"
                "vmovl.u8   q11, d3             \n"
                "vmovl.u16  q0, d16             \n"
                "vmovl.u16  q1, d17             \n"
                "vmovl.u16  q2, d18             \n"
                "vmovl.u16  q3, d19             \n"
                "vmovl.u16  q8, d20             \n"
                "vmovl.u16  q9, d21             \n"
                "vmovl.u16  q10, d22            \n"
                "vmovl.u16  q11, d23            \n"
                "vcvt.f32.u32   q0, q0          \n"
                "vcvt.f32.u32   q1, q1          \n"
                "vcvt.f32.u32   q2, q2          \n"
                "vcvt.f32.u32   q3, q3          \n"
                "vcvt.f32.u32   q8, q8          \n"
                "vcvt.f32.u32   q9, q9          \n"
                "subs       %0, #1              \n"
                "vst1.f32   {d0-d3}, [%2]!      \n"
                "vcvt.f32.u32   q10, q10        \n"
                "vcvt.f32.u32   q11, q11        \n"
                "vst1.f32   {d4-d7}, [%3]!      \n"
                "vst1.f32   {d16-d19}, [%4]!    \n"
                "vst1.f32   {d20-d23}, [%5]!    \n"
                "bne        0b                  \n"
                : "=r"(nn),   // %0
                "=r"(rgba), // %1
                "=r"(ptr0), // %2
                "=r"(ptr1), // %3
                "=r"(ptr2), // %4
                "=r"(ptr3)  // %5
                : "0"(nn),
                "1"(rgba),
                "2"(ptr0),
                "3"(ptr1),
                "4"(ptr2),
                "5"(ptr3)
                : "cc", "memory", "q0", "q1", "q2", "q3", "q8", "q9", "q10", "q11");
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for (; remain > 0; remain--)
        {
            *ptr0 = rgba[0];
            *ptr1 = rgba[1];
            *ptr2 = rgba[2];
            *ptr3 = rgba[3];

            rgba += 4;
            ptr0++;
            ptr1++;
            ptr2++;
            ptr3++;
        }

        rgba += wgap;
    }

    return 0;
}